

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O1

Sub_Object __thiscall Sub_Object::Narrow(Sub_Object *this,Am_Object *object)

{
  int iVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  undefined8 uVar4;
  Am_Value value;
  Am_Value local_28;
  
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)object,10000);
  Am_Value::Am_Value(&local_28,pAVar2);
  if (local_28.type == 2) {
    iVar1 = Am_Value::operator_cast_to_int(&local_28);
    if (iVar1 == 0x2a) {
      pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(object);
      (this->super_Am_Object).data = (Am_Object_Data *)pAVar3;
      Am_Value::~Am_Value(&local_28);
      return (Sub_Object)(Am_Object)this;
    }
  }
  uVar4 = Am_Error("** All hell breaks loose\n");
  Am_Value::~Am_Value(&local_28);
  _Unwind_Resume(uVar4);
}

Assistant:

static Sub_Object Narrow(Am_Object object)
  {
    Am_Value value = object.Get(LEFT);
    if ((value.type == Am_INT) && ((int)value == 42))
      return (Sub_Object)(Am_Wrapper *)object; // two casts needed because
                                               // no constructor for Am_Object
    else {
      Am_Error("** All hell breaks loose\n");
      return (Sub_Object)(Am_Wrapper *)Am_No_Object;
    }
  }